

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::Test<3u>
          (CompressedSubImageTest *this,GLenum internalformat)

{
  bool bVar1;
  
  CreateTextures(this,0x8c1a);
  PrepareReferenceData<3u>(this,internalformat);
  PrepareStorage<3u>(this,internalformat);
  bVar1 = CompressedTextureSubImage<3u>(this,internalformat);
  if (bVar1) {
    if (this->m_reference != (GLubyte *)0x0) {
      bVar1 = CheckData(this,0x8c1a,internalformat);
      if (!bVar1) goto LAB_00ad2666;
    }
    bVar1 = true;
  }
  else {
LAB_00ad2666:
    bVar1 = false;
  }
  CleanAll(this);
  return bVar1;
}

Assistant:

bool CompressedSubImageTest::Test(glw::GLenum internalformat)
{
	/* Create texture image. */
	CreateTextures(TextureTarget<D>());
	PrepareReferenceData<D>(internalformat);
	PrepareStorage<D>(internalformat);

	/* Setup data with CompressedTextureSubImage<D>D function and check for errors. */
	if (!CompressedTextureSubImage<D>(internalformat))
	{
		CleanAll();

		return false;
	}

	/* If compressed reference data was generated than compare values. */
	if (m_reference)
	{
		if (!CheckData(TextureTarget<D>(), internalformat))
		{
			CleanAll();

			return false;
		}
	}

	CleanAll();

	return true;
}